

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

ProducerBase * __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::add_producer
          (ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          ProducerBase *producer)

{
  bool bVar1;
  __pointer_type pPVar2;
  ProducerBase *in_RSI;
  long in_RDI;
  memory_order in_stack_00000020;
  memory_order in_stack_00000024;
  __pointer_type in_stack_00000028;
  __pointer_type prevTail;
  undefined8 in_stack_ffffffffffffffa0;
  atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
  *in_stack_ffffffffffffffa8;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  ProducerBase *local_20;
  
  if (in_RSI == (ProducerBase *)0x0) {
    local_20 = (ProducerBase *)0x0;
  }
  else {
    LOCK();
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
    UNLOCK();
    pPVar2 = std::
             atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
             ::load(in_stack_ffffffffffffffa8,
                    (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    do {
      pCVar3 = (ConcurrentQueueProducerTypelessBase *)0x0;
      if (pPVar2 != (__pointer_type)0x0) {
        pCVar3 = &pPVar2->super_ConcurrentQueueProducerTypelessBase;
      }
      (in_RSI->super_ConcurrentQueueProducerTypelessBase).next = pCVar3;
      bVar1 = std::
              atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
              ::compare_exchange_weak
                        ((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                          *)producer,(__pointer_type *)prevTail,in_stack_00000028,in_stack_00000024,
                         in_stack_00000020);
      local_20 = in_RSI;
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  return local_20;
}

Assistant:

ProducerBase* add_producer(ProducerBase* producer)
    {
        // Handle failed memory allocation
        if (producer == nullptr) {
            return nullptr;
        }
        
        producerCount.fetch_add(1, std::memory_order_relaxed);
        
        // Add it to the lock-free list
        auto prevTail = producerListTail.load(std::memory_order_relaxed);
        do {
            producer->next = prevTail;
        } while (!producerListTail.compare_exchange_weak(prevTail, producer, std::memory_order_release, std::memory_order_relaxed));
        
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
        if (producer->isExplicit) {
            auto prevTailExplicit = explicitProducers.load(std::memory_order_relaxed);
            do {
                static_cast<ExplicitProducer*>(producer)->nextExplicitProducer = prevTailExplicit;
            } while (!explicitProducers.compare_exchange_weak(prevTailExplicit, static_cast<ExplicitProducer*>(producer), std::memory_order_release, std::memory_order_relaxed));
        }
        else {
            auto prevTailImplicit = implicitProducers.load(std::memory_order_relaxed);
            do {
                static_cast<ImplicitProducer*>(producer)->nextImplicitProducer = prevTailImplicit;
            } while (!implicitProducers.compare_exchange_weak(prevTailImplicit, static_cast<ImplicitProducer*>(producer), std::memory_order_release, std::memory_order_relaxed));
        }
#endif
        
        return producer;
    }